

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O3

void __thiscall
duckdb::ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
          (ParquetUUIDOperator *this,ColumnWriterStatistics *stats_p,
          ParquetUUIDTargetType target_value)

{
  ParquetUUIDOperator *pPVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ParquetUUIDTargetType target_value_local;
  
  uVar3 = target_value.bytes._0_8_;
  pPVar1 = this + 9;
  if (this[8] == (ParquetUUIDOperator)0x1) {
    uVar2 = (ulong)stats_p >> 0x38 | ((ulong)stats_p & 0xff000000000000) >> 0x28 |
            ((ulong)stats_p & 0xff0000000000) >> 0x18 | ((ulong)stats_p & 0xff00000000) >> 8 |
            ((ulong)stats_p & 0xff000000) << 8 | ((ulong)stats_p & 0xff0000) << 0x18 |
            ((ulong)stats_p & 0xff00) << 0x28 | (long)stats_p << 0x38;
    uVar4 = *(ulong *)pPVar1;
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    if (uVar2 == uVar4) {
      uVar4 = *(ulong *)(this + 0x11);
      uVar2 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      uVar5 = 0;
      if (uVar2 != uVar4) goto LAB_01ce9c31;
    }
    else {
LAB_01ce9c31:
      uVar5 = -(uint)(uVar2 < uVar4) | 1;
    }
    if ((int)uVar5 < 0) {
      *(ColumnWriterStatistics **)pPVar1 = stats_p;
      *(ulong *)(this + 0x11) = uVar3;
    }
    uVar2 = (ulong)stats_p >> 0x38 | ((ulong)stats_p & 0xff000000000000) >> 0x28 |
            ((ulong)stats_p & 0xff0000000000) >> 0x18 | ((ulong)stats_p & 0xff00000000) >> 8 |
            ((ulong)stats_p & 0xff000000) << 8 | ((ulong)stats_p & 0xff0000) << 0x18 |
            ((ulong)stats_p & 0xff00) << 0x28 | (long)stats_p << 0x38;
    uVar4 = *(ulong *)(this + 0x19);
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    if (uVar2 == uVar4) {
      uVar4 = *(ulong *)(this + 0x21);
      uVar2 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      uVar5 = 0;
      if (uVar2 != uVar4) goto LAB_01ce9c71;
    }
    else {
LAB_01ce9c71:
      uVar5 = -(uint)(uVar2 < uVar4) | 1;
    }
    if ((int)uVar5 < 1) goto LAB_01ce9c9b;
  }
  else {
    *(ColumnWriterStatistics **)pPVar1 = stats_p;
    *(ulong *)(this + 0x11) = uVar3;
  }
  *(ColumnWriterStatistics **)(this + 0x19) = stats_p;
  *(ulong *)(this + 0x21) = uVar3;
LAB_01ce9c9b:
  this[8] = (ParquetUUIDOperator)0x1;
  return;
}

Assistant:

static void HandleStats(ColumnWriterStatistics *stats_p, TGT target_value) {
		auto &stats = stats_p->Cast<UUIDStatisticsState>();
		if (!stats.has_stats || memcmp(target_value.bytes, stats.min, ParquetUUIDTargetType::PARQUET_UUID_SIZE) < 0) {
			memcpy(stats.min, target_value.bytes, ParquetUUIDTargetType::PARQUET_UUID_SIZE);
		}
		if (!stats.has_stats || memcmp(target_value.bytes, stats.max, ParquetUUIDTargetType::PARQUET_UUID_SIZE) > 0) {
			memcpy(stats.max, target_value.bytes, ParquetUUIDTargetType::PARQUET_UUID_SIZE);
		}
		stats.has_stats = true;
	}